

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O0

SinkFinalizeType __thiscall
duckdb::PhysicalUngroupedAggregate::Finalize
          (PhysicalUngroupedAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  bool bVar1;
  UngroupedAggregateGlobalSinkState *pUVar2;
  GlobalSinkState *in_RDI;
  UngroupedAggregateGlobalSinkState *gstate;
  Event *in_stack_00000040;
  Pipeline *in_stack_00000048;
  PhysicalUngroupedAggregate *in_stack_00000050;
  SinkFinalizeType local_1;
  
  pUVar2 = GlobalSinkState::Cast<duckdb::UngroupedAggregateGlobalSinkState>(in_RDI);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
                      *)0x171a33a);
  if (bVar1) {
    local_1 = FinalizeDistinct(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                               (ClientContext *)this,(GlobalSinkState *)pipeline);
  }
  else {
    pUVar2->finished = true;
    local_1 = READY;
  }
  return local_1;
}

Assistant:

SinkFinalizeType PhysicalUngroupedAggregate::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                      OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<UngroupedAggregateGlobalSinkState>();

	if (distinct_data) {
		return FinalizeDistinct(pipeline, event, context, input.global_state);
	}

	D_ASSERT(!gstate.finished);
	gstate.finished = true;
	return SinkFinalizeType::READY;
}